

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceDefinition
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  LocationRecorder location;
  
  bVar1 = Consume(this,"service");
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,service_location,1);
    LocationRecorder::RecordLegacyLocation(&location,&service->super_Message,NAME);
    output = ServiceDescriptorProto::mutable_name_abi_cxx11_(service);
    bVar1 = ConsumeIdentifier(this,output,"Expected service name.");
    LocationRecorder::~LocationRecorder(&location);
    if (bVar1) {
      bVar1 = ParseServiceBlock(this,service,service_location,containing_file);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceDefinition(
    ServiceDescriptorProto* service,
    const LocationRecorder& service_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("service"));

  {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        service, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(service->mutable_name(), "Expected service name."));
  }

  DO(ParseServiceBlock(service, service_location, containing_file));
  return true;
}